

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall
PhyloTree::PhyloTree
          (PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  pointer pbVar1;
  pointer pbVar2;
  size_type pos;
  pointer this_00;
  size_type pos_00;
  reference local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  size_type local_98;
  size_type local_90;
  pointer local_88;
  reference local_80;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> partition;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> new_bitset;
  
  (this->newick)._M_dataplus._M_p = (pointer)&(this->newick).field_2;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = &this->leaf2NumMap;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_a0,leaf2NumMap);
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (leaf2NumMap->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (leaf2NumMap->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&this->edges,
             ((long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x48);
  local_90 = (long)pbVar1 - (long)pbVar2 >> 5;
  local_88 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_98 = local_90 - 1;
  for (this_00 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != local_88; this_00 = this_00 + 1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&new_bitset,local_90,0,(allocator<unsigned_long> *)&partition);
    Bipartition::getPartition(&partition,&this_00->super_Bipartition);
    pos_00 = partition.m_num_bits;
    for (pos = local_98; pos_00 = pos_00 - 1, pos != 0xffffffffffffffff; pos = pos - 1) {
      local_b0 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&partition,pos_00);
      local_80 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&new_bitset,pos);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
                (&local_80,&local_b0);
    }
    std::
    make_shared<Bipartition,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&>
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
    PhyloTreeEdge::setOriginalEdge(this_00,(shared_ptr<Bipartition> *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0.m_mask);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&this->edges,this_00);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              (&partition);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              (&new_bitset);
  }
  return;
}

Assistant:

PhyloTree::PhyloTree(vector<PhyloTreeEdge> &edges, vector<string> &leaf2NumMap) : leaf2NumMap(leaf2NumMap) {
//    this->leaf2NumMap = leaf2NumMap;
    size_t len = leaf2NumMap.size();
    this->edges.reserve(edges.size());
    for (auto &edge : edges) {
        boost::dynamic_bitset<> new_bitset(len);
        auto partition = edge.getPartition();
        auto plen = partition.size();
        for (size_t i=0; i < len; ++i) {
            new_bitset[len - i - 1] = partition[plen - i - 1];
        }
        edge.setOriginalEdge(make_shared<Bipartition>(new_bitset));
        this->edges.push_back(edge);
    }
}